

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  undefined8 uVar1;
  undefined8 uVar2;
  U32 UVar3;
  ZSTD_strategy ZVar4;
  ZSTD_literalCompressionMode_e ZVar5;
  HUF_repeat HVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  uint *puVar8;
  ZSTD_fseCTables_t *prevCTable;
  symbolEncodingType_e sVar9;
  size_t err_code_3;
  size_t __n;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  U32 *pUVar17;
  ulong uVar18;
  BYTE *pBVar19;
  ulong uVar20;
  long lVar21;
  size_t dstSize;
  bool bVar22;
  uint uVar23;
  rawSeqStore_t *rawSeqStore;
  size_t err_code_2;
  size_t sVar24;
  FSE_CTable *pFVar25;
  seqStore_t *psVar26;
  BYTE *istart;
  byte *pbVar27;
  byte *pbVar28;
  undefined1 auVar29 [16];
  uint max;
  byte local_1a9;
  size_t local_1a8;
  BYTE *local_1a0;
  seqStore_t *local_198;
  ZSTD_compressedBlockState_t *local_190;
  uint *local_188;
  ZSTD_compressedBlockState_t *local_180;
  U32 *local_178;
  symbolEncodingType_e local_16c;
  seqDef *local_168;
  ulong local_160;
  ulong local_158;
  BYTE *local_150;
  BYTE *local_148;
  ulong local_140;
  ZSTD_fseCTables_t *local_138;
  BYTE *local_130;
  seqDef *local_128;
  ZSTD_fseCTables_t *local_120;
  byte *local_118;
  size_t local_110;
  uint count [53];
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar7 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar7->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    uVar14 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar3 = (zc->blockState).matchState.nextToUpdate;
    if (UVar3 + 0x180 < uVar14) {
      uVar23 = (uVar14 - UVar3) - 0x180;
      if (0xbf < uVar23) {
        uVar23 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar14 - uVar23;
    }
    iVar16 = 1;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      iVar16 = (uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
    }
    ms = &(zc->blockState).matchState;
    psVar26 = &zc->seqStore;
    pUVar17 = ((zc->blockState).nextCBlock)->rep;
    lVar21 = 0;
    do {
      pUVar17[lVar21] = pZVar7->rep[lVar21];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    local_188 = (uint *)dst;
    local_1a8 = dstCapacity;
    local_198 = psVar26;
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      rawSeqStore = &zc->externSeqStore;
LAB_0010de74:
      __n = ZSTD_ldm_blockCompress(rawSeqStore,ms,psVar26,pUVar17,src,srcSize);
    }
    else {
      if ((zc->appliedParams).ldmParams.enableLdm != 0) {
        count[2] = 0;
        count[3] = 0;
        count[4] = 0;
        count[5] = 0;
        count._0_8_ = zc->ldmSequences;
        count._24_8_ = zc->maxNbLdmSequences;
        sVar12 = ZSTD_ldm_generateSequences
                           (&zc->ldmState,(rawSeqStore_t *)count,&(zc->appliedParams).ldmParams,src,
                            srcSize);
        if (0xffffffffffffff88 < sVar12) {
          return sVar12;
        }
        pUVar17 = ((zc->blockState).nextCBlock)->rep;
        rawSeqStore = (rawSeqStore_t *)count;
        goto LAB_0010de74;
      }
      __n = (**(code **)((long)ZSTD_selectBlockCompressor::blockCompressor[0] +
                        (long)(int)(zc->appliedParams).cParams.strategy * 8 +
                        (ulong)(uint)(iVar16 * 0x50)))(ms,psVar26,pUVar17,src,srcSize);
    }
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
    pBVar19 = (zc->seqStore).lit + __n;
    (zc->seqStore).lit = pBVar19;
    local_180 = (zc->blockState).prevCBlock;
    local_1a9 = 0x39 < (zc->appliedParams).cParams.windowLog;
    local_190 = (zc->blockState).nextCBlock;
    ZVar4 = (zc->appliedParams).cParams.strategy;
    local_160 = (ulong)ZVar4;
    local_1a0 = (zc->seqStore).litStart;
    uVar20 = (long)pBVar19 - (long)local_1a0;
    ZVar5 = (zc->appliedParams).literalCompressionMode;
    bVar22 = true;
    if (ZVar5 != ZSTD_lcm_huffman) {
      if (ZVar5 == ZSTD_lcm_uncompressed) {
        bVar22 = false;
      }
      else if (ZVar4 == ZSTD_fast) {
        bVar22 = (zc->appliedParams).cParams.targetLength == 0;
      }
    }
    local_128 = (zc->seqStore).sequencesStart;
    local_168 = (zc->seqStore).sequences;
    local_178 = zc->entropyWorkspace;
    local_158 = (ulong)(uint)zc->bmi2;
    local_150 = (zc->seqStore).ofCode;
    bVar13 = 6;
    if (ZSTD_btopt < ZVar4) {
      bVar13 = (char)ZVar4 - 1;
    }
    local_148 = (zc->seqStore).llCode;
    local_130 = (zc->seqStore).mlCode;
    local_110 = srcSize;
    memcpy(local_190,local_180,0x404);
    if (bVar22) {
      HVar6 = (local_180->entropy).huf.repeatMode;
      uVar18 = 0x3f;
      if (HVar6 == HUF_repeat_valid) {
        uVar18 = 6;
      }
      if (uVar20 <= uVar18) goto LAB_0010e188;
      uVar18 = ((ulong)(0x3ff < uVar20) - (ulong)(uVar20 < 0x4000)) + 4;
      sVar24 = 0xffffffffffffffba;
      dstSize = local_1a8 - uVar18;
      sVar12 = local_1a8;
      if (uVar18 <= local_1a8 && dstSize != 0) {
        bVar22 = uVar20 < 0x401 && (uint)local_160 < 4;
        max = HVar6;
        if (uVar18 == 3 && HVar6 == HUF_repeat_valid || uVar20 < 0x100) {
          uVar10 = HUF_compress1X_repeat
                             ((void *)((long)local_188 + uVar18),dstSize,local_1a0,uVar20,0xff,0xb,
                              local_178,0x1800,(HUF_CElt *)local_190,&max,(uint)bVar22,
                              (int)local_158);
        }
        else {
          uVar10 = HUF_compress4X_repeat
                             ((void *)((long)local_188 + uVar18),dstSize,local_1a0,uVar20,0xff,0xb,
                              local_178,0x1800,(HUF_CElt *)local_190,&max,(uint)bVar22,
                              (int)local_158);
        }
        puVar8 = local_188;
        uVar14 = 3 - (max == 0);
        if ((uVar20 - (uVar20 >> (bVar13 & 0x3f))) - 2 <= uVar10 || 0xffffffffffffff87 < uVar10 - 1)
        {
          memcpy(local_190,local_180,0x404);
          goto LAB_0010e188;
        }
        iVar16 = (int)uVar20;
        if (uVar10 != 1) {
          if (max == 0) {
            (local_190->entropy).huf.repeatMode = HUF_repeat_check;
          }
          iVar15 = (int)uVar10;
          if (uVar18 == 5) {
            *local_188 = iVar15 * 0x400000 + iVar16 * 0x10 | uVar14 | 0xc;
            *(char *)(local_188 + 1) = (char)(uVar10 >> 10);
          }
          else if (uVar18 == 4) {
            *local_188 = iVar15 * 0x40000 + iVar16 * 0x10 | uVar14 | 8;
          }
          else {
            iVar16 = iVar15 * 0x4000 +
                     ((uVar14 | iVar16 * 0x10 +
                                (uint)(uVar18 == 3 && HVar6 == HUF_repeat_valid || uVar20 < 0x100) *
                                4) ^ 4);
            *(short *)local_188 = (short)iVar16;
            *(char *)((long)local_188 + 2) = (char)((uint)iVar16 >> 0x10);
          }
          sVar24 = uVar10 + uVar18;
          sVar12 = local_1a8;
          goto LAB_0010e1a8;
        }
        memcpy(local_190,local_180,0x404);
        lVar21 = ((ulong)(0x1f < uVar20) + 1) - (ulong)(uVar20 < 0x1000);
        lVar11 = lVar21 + 1;
        if (lVar11 == 3) {
          *puVar8 = iVar16 << 4 | 0xd;
        }
        else if ((int)lVar11 == 2) {
          *(ushort *)puVar8 = (ushort)(iVar16 << 4) | 5;
        }
        else {
          *(char *)puVar8 = (char)uVar20 * '\b' + '\x01';
        }
        *(BYTE *)((long)puVar8 + lVar11) = *local_1a0;
        sVar12 = local_1a8;
        uVar20 = (ulong)((int)lVar21 + 2);
        goto LAB_0010e1b5;
      }
    }
    else {
LAB_0010e188:
      sVar12 = local_1a8;
      sVar24 = ZSTD_noCompressLiterals(local_188,local_1a8,local_1a0,uVar20);
LAB_0010e1a8:
      uVar20 = sVar24;
      if (sVar24 < 0xffffffffffffff89) {
LAB_0010e1b5:
        puVar8 = local_188;
        pZVar7 = local_190;
        sVar24 = 0xffffffffffffffba;
        if (3 < (long)(sVar12 - uVar20)) {
          uVar18 = (long)local_168 - (long)local_128 >> 3;
          pbVar27 = (byte *)(uVar20 + (long)local_188);
          if (uVar18 < 0x7f) {
            *pbVar27 = (byte)uVar18;
            pbVar27 = pbVar27 + 1;
          }
          else if (uVar18 < 0x7f00) {
            *pbVar27 = (byte)(uVar18 >> 8) | 0x80;
            pbVar27[1] = (byte)uVar18;
            pbVar27 = pbVar27 + 2;
          }
          else {
            *pbVar27 = 0xff;
            *(short *)(pbVar27 + 1) = (short)uVar18 + -0x7f00;
            pbVar27 = pbVar27 + 3;
          }
          local_138 = &(local_190->entropy).fse;
          if (local_168 == local_128) {
            memcpy(local_138,&(local_180->entropy).fse,0xde0);
            local_188 = puVar8;
LAB_0010e69d:
            sVar24 = (long)pbVar27 - (long)local_188;
            sVar12 = local_1a8;
            if (sVar24 == 0) goto LAB_0010e6ff;
          }
          else {
            local_168 = (seqDef *)(local_190->entropy).fse.litlengthCTable;
            local_1a0 = (BYTE *)((long)local_188 + sVar12);
            pbVar28 = pbVar27 + 1;
            local_118 = pbVar27;
            ZSTD_seqToCodes(local_198);
            pUVar17 = local_178;
            max = 0x23;
            sVar24 = 0x10e2ad;
            sVar12 = HIST_countFast_wksp(count,&max,local_148,uVar18,local_178,0x1800);
            (pZVar7->entropy).fse.litlength_repeatMode =
                 (local_180->entropy).fse.litlength_repeatMode;
            pFVar25 = (local_180->entropy).fse.litlengthCTable;
            local_16c = ZSTD_selectEncodingType
                                  (&(pZVar7->entropy).fse.litlength_repeatMode,count,max,sVar12,
                                   uVar18,9,pFVar25,LL_defaultNorm,6,ZSTD_defaultAllowed,
                                   (ZSTD_strategy)local_160);
            local_198 = (seqStore_t *)pbVar28;
            sVar24 = ZSTD_buildCTable(pbVar28,(long)local_1a0 - (long)pbVar28,&local_168->offset,9,
                                      local_16c,count,max,local_148,uVar18,LL_defaultNorm,6,0x23,
                                      pFVar25,0x524,pUVar17,sVar24);
            pZVar7 = local_180;
            sVar12 = local_1a8;
            if (sVar24 < 0xffffffffffffff89) {
              pbVar28 = (byte *)((long)local_198 + sVar24);
              local_120 = &(local_180->entropy).fse;
              max = 0x1f;
              sVar24 = 0x10e3cd;
              sVar12 = HIST_countFast_wksp(count,&max,local_150,uVar18,pUVar17,0x1800);
              prevCTable = local_120;
              (local_190->entropy).fse.offcode_repeatMode = (pZVar7->entropy).fse.offcode_repeatMode
              ;
              sVar9 = ZSTD_selectEncodingType
                                (&(local_190->entropy).fse.offcode_repeatMode,count,max,sVar12,
                                 uVar18,8,local_120->offcodeCTable,OF_defaultNorm,5,
                                 (uint)(max < 0x1d),(ZSTD_strategy)local_160);
              local_140 = (ulong)sVar9;
              sVar24 = ZSTD_buildCTable(pbVar28,(long)local_1a0 - (long)pbVar28,
                                        local_138->offcodeCTable,8,sVar9,count,max,local_150,uVar18,
                                        OF_defaultNorm,5,0x1c,prevCTable->offcodeCTable,0x304,
                                        pUVar17,sVar24);
              pZVar7 = local_190;
              sVar12 = local_1a8;
              if (sVar24 < 0xffffffffffffff89) {
                pbVar27 = pbVar28 + sVar24;
                psVar26 = (seqStore_t *)(byte *)0x0;
                if (local_16c == set_compressed) {
                  psVar26 = local_198;
                }
                if ((int)local_140 == 2) {
                  psVar26 = (seqStore_t *)pbVar28;
                }
                local_198 = (seqStore_t *)(local_190->entropy).fse.matchlengthCTable;
                max = 0x34;
                sVar24 = 0x10e501;
                sVar12 = HIST_countFast_wksp(count,&max,local_130,uVar18,local_178,0x1800);
                (pZVar7->entropy).fse.matchlength_repeatMode =
                     (local_180->entropy).fse.matchlength_repeatMode;
                pFVar25 = (local_180->entropy).fse.matchlengthCTable;
                sVar9 = ZSTD_selectEncodingType
                                  (&(pZVar7->entropy).fse.matchlength_repeatMode,count,max,sVar12,
                                   uVar18,9,pFVar25,ML_defaultNorm,6,ZSTD_defaultAllowed,
                                   (ZSTD_strategy)local_160);
                pBVar19 = local_130;
                sVar24 = ZSTD_buildCTable(pbVar27,(long)local_1a0 - (long)pbVar27,
                                          (FSE_CTable *)local_198,9,sVar9,count,max,local_130,uVar18
                                          ,ML_defaultNorm,6,0x34,pFVar25,0x5ac,local_178,sVar24);
                if (sVar9 == set_compressed) {
                  psVar26 = (seqStore_t *)pbVar27;
                }
                sVar12 = local_1a8;
                if (sVar24 < 0xffffffffffffff89) {
                  pbVar27 = pbVar27 + sVar24;
                  *local_118 = (char)((int)local_140 << 4) + (char)(local_16c << 6) +
                               (char)sVar9 * '\x04';
                  sVar24 = ZSTD_encodeSequences
                                     (pbVar27,(long)local_1a0 - (long)pbVar27,
                                      (FSE_CTable *)local_198,pBVar19,local_138->offcodeCTable,
                                      local_150,&local_168->offset,local_148,local_128,uVar18,
                                      (uint)local_1a9,(int)local_158);
                  sVar12 = local_1a8;
                  if (sVar24 < 0xffffffffffffff89) {
                    pbVar27 = pbVar27 + sVar24;
                    if ((psVar26 != (seqStore_t *)0x0) && ((long)pbVar27 - (long)psVar26 < 4))
                    goto LAB_0010e6ff;
                    goto LAB_0010e69d;
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((sVar12 < local_110) || (sVar24 != 0xffffffffffffffba)) {
      if (0xffffffffffffff88 < sVar24) goto LAB_0010e702;
      ZVar4 = (zc->appliedParams).cParams.strategy;
      bVar13 = 6;
      if (ZSTD_btopt < ZVar4) {
        bVar13 = (char)ZVar4 - 1;
      }
      if (sVar24 < (local_110 - (local_110 >> (bVar13 & 0x3f))) - 2) {
        uVar1 = (zc->blockState).prevCBlock;
        uVar2 = (zc->blockState).nextCBlock;
        auVar29._8_4_ = (int)uVar1;
        auVar29._0_8_ = uVar2;
        auVar29._12_4_ = (int)((ulong)uVar1 >> 0x20);
        (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar2;
        (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar29._8_8_;
        goto LAB_0010e702;
      }
    }
  }
LAB_0010e6ff:
  sVar24 = 0;
LAB_0010e702:
  pZVar7 = (zc->blockState).prevCBlock;
  if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return sVar24;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}